

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nfrule.cpp
# Opt level: O3

void __thiscall
icu_63::NFRule::parseRuleDescriptor(NFRule *this,UnicodeString *description,UErrorCode *status)

{
  undefined4 uVar1;
  UBool UVar2;
  int8_t iVar3;
  int16_t iVar4;
  int32_t iVar5;
  undefined8 uVar6;
  char16_t *pcVar7;
  short sVar8;
  undefined4 uVar9;
  char16_t cVar10;
  uint uVar11;
  ulong uVar12;
  uint c;
  ulong uVar14;
  int iVar15;
  char16_t cVar16;
  long lVar17;
  UnicodeString descriptor;
  UnicodeString local_b8;
  UErrorCode *local_78;
  ConstChar16Ptr local_70;
  ConstChar16Ptr local_68;
  char16_t *local_60;
  char16_t *local_50;
  undefined6 *local_40;
  ulong uVar13;
  
  sVar8 = (description->fUnion).fStackFields.fLengthAndFlags;
  if (sVar8 < 0) {
    iVar5 = (description->fUnion).fFields.fLength;
  }
  else {
    iVar5 = (int)sVar8 >> 5;
  }
  iVar5 = UnicodeString::doIndexOf(description,L':',0,iVar5);
  if (iVar5 == -1) goto LAB_00265ce1;
  local_b8.super_Replaceable.super_UObject._vptr_UObject = (UObject)&PTR__UnicodeString_003febe0;
  local_b8.fUnion.fStackFields.fLengthAndFlags = 2;
  UnicodeString::unBogus(&local_b8);
  uVar9 = local_b8.fUnion.fFields.fLength;
  if (-1 < local_b8.fUnion.fStackFields.fLengthAndFlags) {
    uVar9 = (int)local_b8.fUnion.fStackFields.fLengthAndFlags >> 5;
  }
  UnicodeString::doReplace(&local_b8,0,uVar9,description,0,iVar5);
  lVar17 = (long)iVar5;
  do {
    lVar17 = lVar17 + 1;
    sVar8 = (description->fUnion).fStackFields.fLengthAndFlags;
    if (sVar8 < 0) {
      uVar11 = (description->fUnion).fFields.fLength;
    }
    else {
      uVar11 = (int)sVar8 >> 5;
    }
    if ((int)uVar11 <= lVar17) break;
    c = 0xffff;
    if ((uint)lVar17 < uVar11) {
      pcVar7 = (char16_t *)((long)&description->fUnion + 2);
      if (((int)sVar8 & 2U) == 0) {
        pcVar7 = (description->fUnion).fFields.fArray;
      }
      c = (uint)(ushort)pcVar7[lVar17];
    }
    UVar2 = PatternProps::isWhiteSpace(c);
  } while (UVar2 != '\0');
  UnicodeString::doReplace(description,0,(uint)lVar17,(UChar *)0x0,0,0);
  local_78 = status;
  uVar9 = (int)local_b8.fUnion.fStackFields.fLengthAndFlags >> 5;
  if (local_b8.fUnion.fStackFields.fLengthAndFlags < 0) {
    uVar9 = local_b8.fUnion.fFields.fLength;
  }
  uVar14 = (ulong)(uint)uVar9;
  if (uVar9 == 0) {
    cVar10 = L'\xffff';
    cVar16 = L'\xffff';
LAB_002659de:
    iVar3 = UnicodeString::doCompare(&local_b8,0,uVar9,L"-x",0,2);
    local_40 = &gMinusX;
    if (iVar3 == '\0') {
      this->baseValue = -1;
    }
    else if (uVar9 == 3) {
      if ((cVar16 == L'0') && (cVar10 == L'x')) {
        this->baseValue = -3;
      }
      else if ((cVar16 == L'x') && (cVar10 == L'x')) {
        this->baseValue = -2;
      }
      else {
        if ((cVar16 != L'x') || (cVar10 != L'0')) {
          local_68.p_ = L"NaN";
          iVar3 = UnicodeString::compare(&local_b8,&local_68,3);
          local_50 = local_68.p_;
          if (iVar3 == '\0') {
            this->baseValue = -6;
          }
          else {
            local_70.p_ = L"Inf";
            iVar3 = UnicodeString::compare(&local_b8,&local_70,3);
            local_60 = local_70.p_;
            if (iVar3 != '\0') goto LAB_00265cd7;
            this->baseValue = -5;
          }
          this->radix = 10;
          this->exponent = 0;
          goto LAB_00265cd7;
        }
        this->baseValue = -4;
      }
      this->radix = 10;
      this->exponent = 0;
      if (-1 < local_b8.fUnion.fStackFields.fLengthAndFlags) {
        local_b8.fUnion.fFields.fLength = (int)local_b8.fUnion.fStackFields.fLengthAndFlags >> 5;
      }
      cVar16 = L'\xffff';
      if (1 < (uint)local_b8.fUnion.fFields.fLength) {
        uVar6 = local_b8.fUnion.fStackFields.fBuffer;
        if (((int)local_b8.fUnion.fStackFields.fLengthAndFlags & 2U) == 0) {
          uVar6 = local_b8.fUnion.fFields.fArray;
        }
        cVar16 = *(char16_t *)(uVar6 + 2);
      }
      this->decimalPoint = cVar16;
    }
  }
  else {
    uVar6 = local_b8.fUnion.fFields.fArray;
    if (((int)local_b8.fUnion.fStackFields.fLengthAndFlags & 2U) != 0) {
      uVar6 = local_b8.fUnion.fStackFields.fBuffer;
    }
    cVar16 = *(char16_t *)uVar6;
    cVar10 = *(char16_t *)(uVar6 + ((long)(int)uVar9 + -1) * 2);
    if ((9 < (ushort)(cVar16 + L'￐')) || (cVar10 == L'x')) goto LAB_002659de;
    if ((int)uVar9 < 1) {
      cVar16 = L' ';
      lVar17 = 0;
      uVar13 = 0;
    }
    else {
      uVar12 = 0;
      lVar17 = 0;
      do {
        uVar1 = (int)local_b8.fUnion.fStackFields.fLengthAndFlags >> 5;
        if (local_b8.fUnion.fStackFields.fLengthAndFlags < 0) {
          uVar1 = local_b8.fUnion.fFields.fLength;
        }
        if (uVar12 < (uint)uVar1) {
          uVar6 = local_b8.fUnion.fStackFields.fBuffer;
          if (((int)local_b8.fUnion.fStackFields.fLengthAndFlags & 2U) == 0) {
            uVar6 = local_b8.fUnion.fFields.fArray;
          }
          cVar16 = *(char16_t *)(uVar6 + uVar12 * 2);
          uVar11 = (uint)(ushort)cVar16;
          if (9 < (ushort)(cVar16 + L'￐')) {
            uVar13 = uVar12;
            if ((cVar16 != L'/') && (cVar16 != L'>')) goto LAB_002659b1;
            break;
          }
          lVar17 = (ulong)((ushort)cVar16 - 0x30) + lVar17 * 10;
        }
        else {
          uVar11 = 0xffff;
          cVar16 = L'\xffff';
LAB_002659b1:
          UVar2 = PatternProps::isWhiteSpace(uVar11);
          if (((cVar16 & 0xfffdU) != 0x2c) && (UVar2 == '\0')) goto LAB_00265d25;
        }
        uVar12 = uVar12 + 1;
        uVar13 = uVar14;
      } while (uVar14 != uVar12);
    }
    setBaseValue(this,lVar17,local_78);
    if (cVar16 == L'/') {
      uVar11 = (int)uVar13 + 1;
      uVar13 = (ulong)uVar11;
      if ((int)uVar11 < (int)uVar9) {
        uVar12 = (ulong)uVar11;
        iVar15 = 0;
        do {
          uVar1 = (int)local_b8.fUnion.fStackFields.fLengthAndFlags >> 5;
          if (local_b8.fUnion.fStackFields.fLengthAndFlags < 0) {
            uVar1 = local_b8.fUnion.fFields.fLength;
          }
          if (uVar12 < (uint)uVar1) {
            uVar6 = local_b8.fUnion.fStackFields.fBuffer;
            if (((int)local_b8.fUnion.fStackFields.fLengthAndFlags & 2U) == 0) {
              uVar6 = local_b8.fUnion.fFields.fArray;
            }
            cVar16 = *(char16_t *)(uVar6 + uVar12 * 2);
            uVar11 = (uint)(ushort)cVar16;
            if (9 < (ushort)(cVar16 + L'￐')) {
              if (cVar16 != L'>') goto LAB_00265aeb;
              cVar16 = L'>';
              uVar13 = uVar12 & 0xffffffff;
              break;
            }
            iVar15 = uVar11 + iVar15 * 10 + -0x30;
          }
          else {
            uVar11 = 0xffff;
            cVar16 = L'\xffff';
LAB_00265aeb:
            UVar2 = PatternProps::isWhiteSpace(uVar11);
            if (((cVar16 & 0xfffdU) != 0x2c) && (UVar2 == '\0')) goto LAB_00265d25;
          }
          uVar12 = uVar12 + 1;
          uVar13 = uVar14;
        } while ((int)uVar12 < (int)uVar9);
        this->radix = iVar15;
        if (iVar15 == 0) goto LAB_00265b44;
      }
      else {
        this->radix = 0;
        cVar16 = L'/';
LAB_00265b44:
        *local_78 = U_PARSE_ERROR;
      }
      iVar4 = expectedExponent(this);
      this->exponent = iVar4;
    }
    if (cVar16 == L'>') {
      if (-1 < local_b8.fUnion.fStackFields.fLengthAndFlags) {
        local_b8.fUnion.fFields.fLength = (int)local_b8.fUnion.fStackFields.fLengthAndFlags >> 5;
      }
      if ((int)uVar13 < local_b8.fUnion.fFields.fLength) {
        if (((int)local_b8.fUnion.fStackFields.fLengthAndFlags & 2U) != 0) {
          local_b8.fUnion.fFields.fArray = local_b8.fUnion.fStackFields.fBuffer;
        }
        sVar8 = this->exponent;
        pcVar7 = (char16_t *)((long)local_b8.fUnion.fFields.fArray + (long)(int)uVar13 * 2);
        do {
          if ((((uint)local_b8.fUnion.fFields.fLength <= (uint)uVar13) || (*pcVar7 != L'>')) ||
             (sVar8 < 1)) {
LAB_00265d25:
            *local_78 = U_PARSE_ERROR;
            UnicodeString::~UnicodeString(&local_b8);
            return;
          }
          sVar8 = sVar8 + -1;
          this->exponent = sVar8;
          uVar11 = (uint)uVar13 + 1;
          uVar13 = (ulong)uVar11;
          pcVar7 = pcVar7 + 1;
        } while (local_b8.fUnion.fFields.fLength != uVar11);
      }
    }
  }
LAB_00265cd7:
  UnicodeString::~UnicodeString(&local_b8);
LAB_00265ce1:
  sVar8 = (description->fUnion).fStackFields.fLengthAndFlags;
  if (sVar8 < 0) {
    iVar15 = (description->fUnion).fFields.fLength;
  }
  else {
    iVar15 = (int)sVar8 >> 5;
  }
  if (0 < iVar15) {
    if (((int)sVar8 & 2U) == 0) {
      pcVar7 = (description->fUnion).fFields.fArray;
    }
    else {
      pcVar7 = (description->fUnion).fStackFields.fBuffer;
    }
    if (*pcVar7 == L'\'') {
      UnicodeString::doReplace(description,0,1,(UChar *)0x0,0,0);
    }
  }
  return;
}

Assistant:

void
NFRule::parseRuleDescriptor(UnicodeString& description, UErrorCode& status)
{
    // the description consists of a rule descriptor and a rule body,
    // separated by a colon.  The rule descriptor is optional.  If
    // it's omitted, just set the base value to 0.
    int32_t p = description.indexOf(gColon);
    if (p != -1) {
        // copy the descriptor out into its own string and strip it,
        // along with any trailing whitespace, out of the original
        // description
        UnicodeString descriptor;
        descriptor.setTo(description, 0, p);

        ++p;
        while (p < description.length() && PatternProps::isWhiteSpace(description.charAt(p))) {
            ++p;
        }
        description.removeBetween(0, p);

        // check first to see if the rule descriptor matches the token
        // for one of the special rules.  If it does, set the base
        // value to the correct identifier value
        int descriptorLength = descriptor.length();
        UChar firstChar = descriptor.charAt(0);
        UChar lastChar = descriptor.charAt(descriptorLength - 1);
        if (firstChar >= gZero && firstChar <= gNine && lastChar != gX) {
            // if the rule descriptor begins with a digit, it's a descriptor
            // for a normal rule
            // since we don't have Long.parseLong, and this isn't much work anyway,
            // just build up the value as we encounter the digits.
            int64_t val = 0;
            p = 0;
            UChar c = gSpace;

            // begin parsing the descriptor: copy digits
            // into "tempValue", skip periods, commas, and spaces,
            // stop on a slash or > sign (or at the end of the string),
            // and throw an exception on any other character
            int64_t ll_10 = 10;
            while (p < descriptorLength) {
                c = descriptor.charAt(p);
                if (c >= gZero && c <= gNine) {
                    val = val * ll_10 + (int32_t)(c - gZero);
                }
                else if (c == gSlash || c == gGreaterThan) {
                    break;
                }
                else if (PatternProps::isWhiteSpace(c) || c == gComma || c == gDot) {
                }
                else {
                    // throw new IllegalArgumentException("Illegal character in rule descriptor");
                    status = U_PARSE_ERROR;
                    return;
                }
                ++p;
            }

            // we have the base value, so set it
            setBaseValue(val, status);

            // if we stopped the previous loop on a slash, we're
            // now parsing the rule's radix.  Again, accumulate digits
            // in tempValue, skip punctuation, stop on a > mark, and
            // throw an exception on anything else
            if (c == gSlash) {
                val = 0;
                ++p;
                ll_10 = 10;
                while (p < descriptorLength) {
                    c = descriptor.charAt(p);
                    if (c >= gZero && c <= gNine) {
                        val = val * ll_10 + (int32_t)(c - gZero);
                    }
                    else if (c == gGreaterThan) {
                        break;
                    }
                    else if (PatternProps::isWhiteSpace(c) || c == gComma || c == gDot) {
                    }
                    else {
                        // throw new IllegalArgumentException("Illegal character is rule descriptor");
                        status = U_PARSE_ERROR;
                        return;
                    }
                    ++p;
                }

                // tempValue now contain's the rule's radix.  Set it
                // accordingly, and recalculate the rule's exponent
                radix = (int32_t)val;
                if (radix == 0) {
                    // throw new IllegalArgumentException("Rule can't have radix of 0");
                    status = U_PARSE_ERROR;
                }

                exponent = expectedExponent();
            }

            // if we stopped the previous loop on a > sign, then continue
            // for as long as we still see > signs.  For each one,
            // decrement the exponent (unless the exponent is already 0).
            // If we see another character before reaching the end of
            // the descriptor, that's also a syntax error.
            if (c == gGreaterThan) {
                while (p < descriptor.length()) {
                    c = descriptor.charAt(p);
                    if (c == gGreaterThan && exponent > 0) {
                        --exponent;
                    } else {
                        // throw new IllegalArgumentException("Illegal character in rule descriptor");
                        status = U_PARSE_ERROR;
                        return;
                    }
                    ++p;
                }
            }
        }
        else if (0 == descriptor.compare(gMinusX, 2)) {
            setType(kNegativeNumberRule);
        }
        else if (descriptorLength == 3) {
            if (firstChar == gZero && lastChar == gX) {
                setBaseValue(kProperFractionRule, status);
                decimalPoint = descriptor.charAt(1);
            }
            else if (firstChar == gX && lastChar == gX) {
                setBaseValue(kImproperFractionRule, status);
                decimalPoint = descriptor.charAt(1);
            }
            else if (firstChar == gX && lastChar == gZero) {
                setBaseValue(kMasterRule, status);
                decimalPoint = descriptor.charAt(1);
            }
            else if (descriptor.compare(gNaN, 3) == 0) {
                setBaseValue(kNaNRule, status);
            }
            else if (descriptor.compare(gInf, 3) == 0) {
                setBaseValue(kInfinityRule, status);
            }
        }
    }
    // else use the default base value for now.

    // finally, if the rule body begins with an apostrophe, strip it off
    // (this is generally used to put whitespace at the beginning of
    // a rule's rule text)
    if (description.length() > 0 && description.charAt(0) == gTick) {
        description.removeBetween(0, 1);
    }

    // return the description with all the stuff we've just waded through
    // stripped off the front.  It now contains just the rule body.
    // return description;
}